

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcTessellationShaderIsolines.cpp
# Opt level: O1

void __thiscall glcts::TessellationShadersIsolines::initTest(TessellationShadersIsolines *this)

{
  iterator __position;
  int iVar1;
  GLenum GVar2;
  undefined4 extraout_var;
  TessellationShaderUtils *this_00;
  vector<glcts::TessellationShadersIsolines::_test_descriptor,std::allocator<glcts::TessellationShadersIsolines::_test_descriptor>>
  *this_01;
  NotSupportedError *this_02;
  long lVar3;
  long lVar4;
  bool bVar5;
  _tessellation_shader_vertex_spacing_conflict vertex_spacing_mode;
  GLfloat tess_levels [4];
  GLint gl_max_tess_gen_level_value;
  undefined1 local_98 [20];
  float fStack_84;
  float fStack_80;
  float fStack_7c;
  float local_78;
  _tessellation_shader_vertex_spacing_conflict _Stack_74;
  float local_68;
  float local_64;
  float local_60;
  _tessellation_shader_vertex_spacing_conflict local_5c;
  float local_58 [4];
  long local_48;
  long local_40;
  GLint local_34;
  Functions *gl;
  
  iVar1 = (*((this->super_TestCaseBase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  gl = (Functions *)CONCAT44(extraout_var,iVar1);
  if ((this->super_TestCaseBase).m_is_tessellation_shader_supported != false) {
    this_00 = (TessellationShaderUtils *)operator_new(0x20);
    TessellationShaderUtils::TessellationShaderUtils(this_00,gl,&this->super_TestCaseBase);
    this->m_utils_ptr = this_00;
    (*gl->genVertexArrays)(1,&this->m_vao_id);
    GVar2 = (*gl->getError)();
    glu::checkError(GVar2,"Could not generate vertex array object",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderIsolines.cpp"
                    ,0x22a);
    (*gl->bindVertexArray)(this->m_vao_id);
    GVar2 = (*gl->getError)();
    glu::checkError(GVar2,"Error binding vertex array object!",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderIsolines.cpp"
                    ,0x22d);
    local_34 = 0;
    (*gl->getIntegerv)((this->super_TestCaseBase).m_glExtTokens.MAX_TESS_GEN_LEVEL,&local_34);
    GVar2 = (*gl->getError)();
    glu::checkError(GVar2,"glGetIntegerv() failed for GL_MAX_TESS_GEN_LEVEL_EXT pname",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderIsolines.cpp"
                    ,0x233);
    local_58[0] = -1.0;
    local_58[1] = 4.0;
    local_58[2] = (float)local_34 * 0.5;
    local_58[3] = (float)local_34;
    this->m_irrelevant_tess_value_1 = -1.0;
    this->m_irrelevant_tess_value_2 = 4.0;
    local_48 = 0;
    do {
      local_68 = local_58[local_48];
      local_40 = 0;
      do {
        local_64 = local_58[local_40];
        lVar4 = 0;
        do {
          local_60 = local_58[lVar4];
          lVar3 = 0;
          do {
            _Stack_74 = *(_tessellation_shader_vertex_spacing_conflict *)
                         ((long)&DAT_01ba9250 + lVar3);
            local_98._12_4_ = local_60;
            local_98._8_4_ = local_60;
            fStack_7c = local_60;
            fStack_80 = local_64;
            local_78 = local_60;
            fStack_84 = local_68;
            local_98._16_4_ = local_60;
            local_98._0_8_ = this;
            local_5c = _Stack_74;
            this_01 = (vector<glcts::TessellationShadersIsolines::_test_descriptor,std::allocator<glcts::TessellationShadersIsolines::_test_descriptor>>
                       *)std::
                         map<glcts::_tessellation_shader_vertex_spacing,_std::vector<glcts::TessellationShadersIsolines::_test_descriptor,_std::allocator<glcts::TessellationShadersIsolines::_test_descriptor>_>,_std::less<glcts::_tessellation_shader_vertex_spacing>,_std::allocator<std::pair<const_glcts::_tessellation_shader_vertex_spacing,_std::vector<glcts::TessellationShadersIsolines::_test_descriptor,_std::allocator<glcts::TessellationShadersIsolines::_test_descriptor>_>_>_>_>
                         ::operator[](&this->m_tests,&local_5c);
            __position._M_current = *(_test_descriptor **)(this_01 + 8);
            if (__position._M_current == *(_test_descriptor **)(this_01 + 0x10)) {
              std::
              vector<glcts::TessellationShadersIsolines::_test_descriptor,std::allocator<glcts::TessellationShadersIsolines::_test_descriptor>>
              ::_M_realloc_insert<glcts::TessellationShadersIsolines::_test_descriptor_const&>
                        (this_01,__position,(_test_descriptor *)local_98);
            }
            else {
              *(ulong *)((__position._M_current)->outer_tess_levels + 3) =
                   CONCAT44(_Stack_74,local_78);
              (__position._M_current)->irrelevant_tess_level = (float)local_98._16_4_;
              (__position._M_current)->outer_tess_levels[0] = fStack_84;
              *(undefined8 *)((__position._M_current)->outer_tess_levels + 1) = _fStack_80;
              (__position._M_current)->parent = (TessellationShadersIsolines *)local_98._0_8_;
              *(undefined8 *)(__position._M_current)->inner_tess_levels = local_98._8_8_;
              *(long *)(this_01 + 8) = *(long *)(this_01 + 8) + 0x28;
            }
            lVar3 = lVar3 + 4;
          } while (lVar3 != 0xc);
          bVar5 = lVar4 == 0;
          lVar4 = lVar4 + 1;
        } while (bVar5);
        local_40 = local_40 + 1;
      } while (local_40 != 4);
      local_48 = local_48 + 1;
    } while (local_48 != 4);
    return;
  }
  this_02 = (NotSupportedError *)__cxa_allocate_exception(0x38);
  local_98._0_8_ = local_98 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_98,"Tessellation shader functionality not supported, skipping","");
  tcu::NotSupportedError::NotSupportedError(this_02,(string *)local_98);
  __cxa_throw(this_02,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

void TessellationShadersIsolines::initTest()
{
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Skip if required extensions are not supported. */
	if (!m_is_tessellation_shader_supported)
	{
		throw tcu::NotSupportedError(TESSELLATION_SHADER_EXTENSION_NOT_SUPPORTED);
	}

	/* Generate Utilities instance */
	m_utils_ptr = new TessellationShaderUtils(gl, this);

	/* Set up vertex array object */
	gl.genVertexArrays(1, &m_vao_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Could not generate vertex array object");

	gl.bindVertexArray(m_vao_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Error binding vertex array object!");

	/* Retrieve GL_MAX_TESS_GEN_LEVEL_EXT value */
	glw::GLint gl_max_tess_gen_level_value = 0;

	gl.getIntegerv(m_glExtTokens.MAX_TESS_GEN_LEVEL, &gl_max_tess_gen_level_value);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glGetIntegerv() failed for GL_MAX_TESS_GEN_LEVEL_EXT pname");

	/* Initialize reference tessellation values */
	const glw::GLfloat tess_levels[] = { -1.0f, 4.0f, float(gl_max_tess_gen_level_value) * 0.5f,
										 float(gl_max_tess_gen_level_value) };
	const unsigned int n_tess_levels = sizeof(tess_levels) / sizeof(tess_levels[0]);

	m_irrelevant_tess_value_1 = tess_levels[0];
	m_irrelevant_tess_value_2 = tess_levels[1];

	/* Initialize all test passes.
	 *
	 * Make sure each relevant outer tessellation level iterates through values
	 * of our interest
	 */
	for (unsigned int outer1_tess_level_index = 0; outer1_tess_level_index < n_tess_levels; ++outer1_tess_level_index)
	{
		for (unsigned int outer2_tess_level_index = 0; outer2_tess_level_index < n_tess_levels;
			 ++outer2_tess_level_index)
		{
			/* To make the test execute in a reasonable time frame, just use
			 * two different levels for the outer tessellation levels */
			DE_STATIC_ASSERT(n_tess_levels >= 2);

			for (unsigned int other_tess_level_index = 0; other_tess_level_index < 2 /* see comment */;
				 ++other_tess_level_index)
			{
				float inner_tess_levels[2] = { tess_levels[other_tess_level_index],
											   tess_levels[other_tess_level_index] };
				float outer_tess_levels[4] = { tess_levels[outer1_tess_level_index],
											   tess_levels[outer2_tess_level_index],
											   tess_levels[other_tess_level_index],
											   tess_levels[other_tess_level_index] };

				/* Finally, iterate over three vertex spacing modes */
				_tessellation_shader_vertex_spacing vertex_spacing_mode;

				const _tessellation_shader_vertex_spacing vs_modes[] = {
					TESSELLATION_SHADER_VERTEX_SPACING_EQUAL, TESSELLATION_SHADER_VERTEX_SPACING_FRACTIONAL_EVEN,
					TESSELLATION_SHADER_VERTEX_SPACING_FRACTIONAL_ODD
				};
				const int n_vs_modes = sizeof(vs_modes) / sizeof(vs_modes[0]);

				for (int n_vs_mode = 0; n_vs_mode < n_vs_modes; ++n_vs_mode)
				{
					vertex_spacing_mode = vs_modes[n_vs_mode];

					_test_descriptor test;

					initTestDescriptor(vertex_spacing_mode, inner_tess_levels, outer_tess_levels,
									   tess_levels[other_tess_level_index], test);

					m_tests[vertex_spacing_mode].push_back(test);
				} /* for (all available vertex spacing modes) */
			}	 /* for (all irrelevant tessellation levels) */
		}		  /* for (all defined second outer tessellation levels) */
	}			  /* for (all defined first outer tessellation levels) */
}